

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_reader.cpp
# Opt level: O0

idx_t __thiscall
duckdb::ListColumnReader::ReadInternal<duckdb::TemplatedListReader>
          (ListColumnReader *this,uint64_t num_values,data_ptr_t define_out,data_ptr_t repeat_out,
          optional_ptr<duckdb::Vector,_true> result_out)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  pointer pCVar4;
  undefined4 extraout_var;
  unsigned_long uVar5;
  undefined4 extraout_var_00;
  idx_t iVar6;
  idx_t iVar7;
  DATA *pDVar8;
  long in_RCX;
  long in_RDX;
  idx_t in_RSI;
  optional_ptr<duckdb::Vector,_true> in_RDI;
  idx_t repdef_idx;
  idx_t child_idx;
  idx_t current_chunk_offset;
  unsigned_long child_req_num_values;
  idx_t child_actual_num_values;
  bool finished;
  DATA data;
  idx_t result_offset;
  Vector *in_stack_ffffffffffffff58;
  optional_ptr<duckdb::Vector,_true> in_stack_ffffffffffffff60;
  ulong local_88;
  ulong local_78;
  ulong local_58;
  DATA local_40;
  idx_t local_30;
  long local_28;
  long local_20;
  idx_t local_18;
  
  local_30 = 0;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_40 = TemplatedListReader::Initialize(in_RDI);
  bVar2 = false;
  do {
    if (bVar2) {
      return local_30;
    }
    if (*(long *)&(((ColumnReader *)((long)in_RDI.ptr + 0x1f0))->dictionary_decoder).field_0x78 == 0
       ) {
      ByteBuffer::zero((ByteBuffer *)0x85b527);
      ByteBuffer::zero((ByteBuffer *)0x85b538);
      pCVar4 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
               operator->((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
                           *)in_stack_ffffffffffffff60.ptr);
      iVar3 = (*pCVar4->_vptr_ColumnReader[9])();
      uVar5 = MinValue<unsigned_long>(0x800,CONCAT44(extraout_var,iVar3));
      duckdb::Vector::ResetFromCache
                ((VectorCache *)
                 &(((ColumnReader *)((long)in_RDI.ptr + 0x1f0))->dictionary_decoder).dict_decoder);
      pCVar4 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
               operator->((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
                           *)in_stack_ffffffffffffff60.ptr);
      iVar3 = (*pCVar4->_vptr_ColumnReader[3])
                        (pCVar4,uVar5,
                         (RleBpDecoder *)
                         (((ColumnReader *)((long)in_RDI.ptr + 0x1f0))->defined_decoder).
                         super_unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>
                         ._M_t.
                         super___uniq_ptr_impl<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb::RleBpDecoder_*,_std::default_delete<duckdb::RleBpDecoder>_>
                         .super__Head_base<0UL,_duckdb::RleBpDecoder_*,_false>,
                         (RleBpDecoder *)
                         (((ColumnReader *)((long)in_RDI.ptr + 0x1f0))->repeated_decoder).
                         super_unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>
                         ._M_t.
                         super___uniq_ptr_impl<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb::RleBpDecoder_*,_std::default_delete<duckdb::RleBpDecoder>_>
                         .super__Head_base<0UL,_duckdb::RleBpDecoder_*,_false>,
                         &(((ColumnReader *)((long)in_RDI.ptr + 0x1f0))->dictionary_decoder).
                          dict_decoder);
      local_58 = CONCAT44(extraout_var_00,iVar3);
    }
    else {
      local_58 = *(ulong *)&(((ColumnReader *)((long)in_RDI.ptr + 0x1f0))->dictionary_decoder).
                            field_0x78;
      *(undefined8 *)&(((ColumnReader *)((long)in_RDI.ptr + 0x1f0))->dictionary_decoder).field_0x78
           = 0;
    }
    if (local_58 == 0) {
      return local_30;
    }
    duckdb::Vector::Verify
              ((ulong)&(((ColumnReader *)((long)in_RDI.ptr + 0x1f0))->dictionary_decoder).
                       dict_decoder);
    iVar6 = TemplatedListReader::GetOffset((optional_ptr<duckdb::Vector,_true>)0x85b615);
    for (local_78 = 0; local_78 < local_58; local_78 = local_78 + 1) {
      bVar1 = *(byte *)((long)&(((((ColumnReader *)((long)in_RDI.ptr + 0x1f0))->repeated_decoder).
                                 super_unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>
                                 ._M_t.
                                 super___uniq_ptr_impl<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_duckdb::RleBpDecoder_*,_std::default_delete<duckdb::RleBpDecoder>_>
                                 .super__Head_base<0UL,_duckdb::RleBpDecoder_*,_false>._M_head_impl)
                               ->buffer_).ptr + local_78);
      iVar7 = ColumnReader::MaxRepeat((ColumnReader *)in_RDI.ptr);
      if (bVar1 == iVar7) {
        TemplatedListReader::HandleRepeat(&local_40,local_30 - 1);
      }
      else {
        if (local_18 <= local_30) {
          bVar2 = true;
          break;
        }
        in_stack_ffffffffffffff60.ptr =
             (Vector *)
             (ulong)*(byte *)((long)&(((((ColumnReader *)((long)in_RDI.ptr + 0x1f0))->
                                       defined_decoder).
                                       super_unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>
                                       ._M_t.
                                       super___uniq_ptr_impl<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_duckdb::RleBpDecoder_*,_std::default_delete<duckdb::RleBpDecoder>_>
                                       .super__Head_base<0UL,_duckdb::RleBpDecoder_*,_false>.
                                      _M_head_impl)->buffer_).ptr + local_78);
        pDVar8 = (DATA *)ColumnReader::MaxDefine((ColumnReader *)in_RDI.ptr);
        if (in_stack_ffffffffffffff60.ptr < pDVar8) {
          in_stack_ffffffffffffff58 =
               (Vector *)
               (ulong)*(byte *)((long)&(((((ColumnReader *)((long)in_RDI.ptr + 0x1f0))->
                                         defined_decoder).
                                         super_unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>
                                         ._M_t.
                                         super___uniq_ptr_impl<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_duckdb::RleBpDecoder_*,_std::default_delete<duckdb::RleBpDecoder>_>
                                         .super__Head_base<0UL,_duckdb::RleBpDecoder_*,_false>.
                                        _M_head_impl)->buffer_).ptr + local_78);
          iVar7 = ColumnReader::MaxDefine((ColumnReader *)in_RDI.ptr);
          if (in_stack_ffffffffffffff58 == (Vector *)(iVar7 - 1)) {
            TemplatedListReader::HandleListStart(&local_40,local_30,local_78 + iVar6,0);
          }
          else {
            TemplatedListReader::HandleNull
                      ((DATA *)in_stack_ffffffffffffff60.ptr,(idx_t)in_stack_ffffffffffffff58);
          }
        }
        else {
          TemplatedListReader::HandleListStart(&local_40,local_30,local_78 + iVar6,1);
        }
        if (local_28 != 0) {
          *(undefined1 *)(local_28 + local_30) =
               *(undefined1 *)
                ((long)&(((((ColumnReader *)((long)in_RDI.ptr + 0x1f0))->repeated_decoder).
                          super_unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::RleBpDecoder_*,_std::default_delete<duckdb::RleBpDecoder>_>
                          .super__Head_base<0UL,_duckdb::RleBpDecoder_*,_false>._M_head_impl)->
                        buffer_).ptr + local_78);
        }
        if (local_20 != 0) {
          *(undefined1 *)(local_20 + local_30) =
               *(undefined1 *)
                ((long)&(((((ColumnReader *)((long)in_RDI.ptr + 0x1f0))->defined_decoder).
                          super_unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::RleBpDecoder_*,_std::default_delete<duckdb::RleBpDecoder>_>
                          .super__Head_base<0UL,_duckdb::RleBpDecoder_*,_false>._M_head_impl)->
                        buffer_).ptr + local_78);
        }
        local_30 = local_30 + 1;
      }
    }
    TemplatedListReader::AppendVector(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0x85b7e1);
    if ((local_78 < local_58) && (local_30 == local_18)) {
      duckdb::Vector::Slice
                ((Vector *)
                 &(((ColumnReader *)((long)in_RDI.ptr + 0x1f0))->dictionary_decoder).dict_decoder,
                 (ulong)&(((ColumnReader *)((long)in_RDI.ptr + 0x1f0))->dictionary_decoder).
                         dict_decoder,local_78);
      *(ulong *)&(((ColumnReader *)((long)in_RDI.ptr + 0x1f0))->dictionary_decoder).field_0x78 =
           local_58 - local_78;
      duckdb::Vector::Verify
                ((ulong)&(((ColumnReader *)((long)in_RDI.ptr + 0x1f0))->dictionary_decoder).
                         dict_decoder);
      for (local_88 = 0;
          local_88 <
          *(ulong *)&(((ColumnReader *)((long)in_RDI.ptr + 0x1f0))->dictionary_decoder).field_0x78;
          local_88 = local_88 + 1) {
        *(undefined1 *)
         ((long)(((ColumnReader *)((long)in_RDI.ptr + 0x1f0))->defined_decoder).
                super_unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>.
                _M_t.
                super___uniq_ptr_impl<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::RleBpDecoder_*,_std::default_delete<duckdb::RleBpDecoder>_>
                .super__Head_base<0UL,_duckdb::RleBpDecoder_*,_false> + local_88) =
             *(undefined1 *)
              ((long)(((ColumnReader *)((long)in_RDI.ptr + 0x1f0))->defined_decoder).
                     super_unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>
                     ._M_t.
                     super___uniq_ptr_impl<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::RleBpDecoder_*,_std::default_delete<duckdb::RleBpDecoder>_>
                     .super__Head_base<0UL,_duckdb::RleBpDecoder_*,_false> + local_78 + local_88);
        *(undefined1 *)
         ((long)(((ColumnReader *)((long)in_RDI.ptr + 0x1f0))->repeated_decoder).
                super_unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>.
                _M_t.
                super___uniq_ptr_impl<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::RleBpDecoder_*,_std::default_delete<duckdb::RleBpDecoder>_>
                .super__Head_base<0UL,_duckdb::RleBpDecoder_*,_false> + local_88) =
             *(undefined1 *)
              ((long)(((ColumnReader *)((long)in_RDI.ptr + 0x1f0))->repeated_decoder).
                     super_unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>
                     ._M_t.
                     super___uniq_ptr_impl<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::RleBpDecoder_*,_std::default_delete<duckdb::RleBpDecoder>_>
                     .super__Head_base<0UL,_duckdb::RleBpDecoder_*,_false> + local_78 + local_88);
      }
    }
  } while( true );
}

Assistant:

idx_t ListColumnReader::ReadInternal(uint64_t num_values, data_ptr_t define_out, data_ptr_t repeat_out,
                                     optional_ptr<Vector> result_out) {
	idx_t result_offset = 0;
	auto data = OP::Initialize(result_out);

	// if an individual list is longer than STANDARD_VECTOR_SIZE we actually have to loop the child read to fill it
	bool finished = false;
	while (!finished) {
		idx_t child_actual_num_values = 0;

		// check if we have any overflow from a previous read
		if (overflow_child_count == 0) {
			// we don't: read elements from the child reader
			child_defines.zero();
			child_repeats.zero();
			// we don't know in advance how many values to read because of the beautiful repetition/definition setup
			// we just read (up to) a vector from the child column, and see if we have read enough
			// if we have not read enough, we read another vector
			// if we have read enough, we leave any unhandled elements in the overflow vector for a subsequent read
			auto child_req_num_values =
			    MinValue<idx_t>(STANDARD_VECTOR_SIZE, child_column_reader->GroupRowsAvailable());
			read_vector.ResetFromCache(read_cache);
			child_actual_num_values =
			    child_column_reader->Read(child_req_num_values, child_defines_ptr, child_repeats_ptr, read_vector);
		} else {
			// we do: use the overflow values
			child_actual_num_values = overflow_child_count;
			overflow_child_count = 0;
		}

		if (child_actual_num_values == 0) {
			// no more elements available: we are done
			break;
		}
		read_vector.Verify(child_actual_num_values);
		idx_t current_chunk_offset = OP::GetOffset(result_out);

		// hard-won piece of code this, modify at your own risk
		// the intuition is that we have to only collapse values into lists that are repeated *on this level*
		// the rest is pretty much handed up as-is as a single-valued list or NULL
		idx_t child_idx;
		for (child_idx = 0; child_idx < child_actual_num_values; child_idx++) {
			if (child_repeats_ptr[child_idx] == MaxRepeat()) {
				// value repeats on this level, append
				D_ASSERT(result_offset > 0);
				OP::HandleRepeat(data, result_offset - 1);
				continue;
			}

			if (result_offset >= num_values) {
				// we ran out of output space
				finished = true;
				break;
			}
			if (child_defines_ptr[child_idx] >= MaxDefine()) {
				// value has been defined down the stack, hence its NOT NULL
				OP::HandleListStart(data, result_offset, child_idx + current_chunk_offset, 1);
			} else if (child_defines_ptr[child_idx] == MaxDefine() - 1) {
				// empty list
				OP::HandleListStart(data, result_offset, child_idx + current_chunk_offset, 0);
			} else {
				// value is NULL somewhere up the stack
				OP::HandleNull(data, result_offset);
			}

			if (repeat_out) {
				repeat_out[result_offset] = child_repeats_ptr[child_idx];
			}
			if (define_out) {
				define_out[result_offset] = child_defines_ptr[child_idx];
			}

			result_offset++;
		}
		// actually append the required elements to the child list
		OP::AppendVector(result_out, read_vector, child_idx);

		// we have read more values from the child reader than we can fit into the result for this read
		// we have to pass everything from child_idx to child_actual_num_values into the next call
		if (child_idx < child_actual_num_values && result_offset == num_values) {
			read_vector.Slice(read_vector, child_idx, child_actual_num_values);
			overflow_child_count = child_actual_num_values - child_idx;
			read_vector.Verify(overflow_child_count);

			// move values in the child repeats and defines *backward* by child_idx
			for (idx_t repdef_idx = 0; repdef_idx < overflow_child_count; repdef_idx++) {
				child_defines_ptr[repdef_idx] = child_defines_ptr[child_idx + repdef_idx];
				child_repeats_ptr[repdef_idx] = child_repeats_ptr[child_idx + repdef_idx];
			}
		}
	}
	return result_offset;
}